

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitstate.cc
# Opt level: O3

bool __thiscall re2::BitState::TrySearch(BitState *this,int id0,char *p0)

{
  int iVar1;
  Job *pJVar2;
  StringPiece *pSVar3;
  char **ppcVar4;
  undefined8 uVar5;
  bool bVar6;
  uint uVar7;
  uint32 uVar9;
  uint uVar10;
  ostream *this_00;
  byte *pbVar11;
  uint uVar12;
  Inst *this_01;
  long lVar13;
  long lVar14;
  byte *p;
  byte *p_00;
  bool local_1c8;
  LogMessage local_1b0;
  int iVar8;
  
  p_00 = (byte *)((this->text_).ptr_ + (this->text_).length_);
  this->njob_ = 0;
  Push(this,id0,p0,0);
  iVar8 = this->njob_;
  if (iVar8 < 1) {
LAB_001330c1:
    local_1c8 = false;
  }
  else {
    local_1c8 = false;
    bVar6 = false;
    do {
      uVar7 = iVar8 - 1;
      this->njob_ = uVar7;
      pJVar2 = this->job_;
      uVar10 = pJVar2[uVar7].id;
      iVar8 = pJVar2[uVar7].arg;
      p = (byte *)pJVar2[uVar7].p;
      lVar14 = (long)(int)uVar10;
      this_01 = this->prog_->inst_ + lVar14;
      uVar7 = this_01->out_opcode_;
      switch(uVar7 & 7) {
      case 0:
switchD_00132cd0_caseD_0:
        LogMessage::LogMessage
                  (&local_1b0,
                   "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/bitstate.cc"
                   ,0xb6,3);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1b0.str_,"Unexpected opcode: ",0x13);
        this_00 = (ostream *)
                  std::ostream::operator<<((ostream *)&local_1b0.str_,this_01->out_opcode_ & 7);
        std::__ostream_insert<char,std::char_traits<char>>(this_00," arg ",5);
        std::ostream::operator<<((ostream *)this_00,iVar8);
        LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_1b0);
        goto LAB_001330c1;
      case 1:
switchD_00132cd0_caseD_1:
        if (iVar8 == 0) {
          Push(this,(int)lVar14,(char *)p,1);
          bVar6 = Prog::Inst::greedy(this_01,this->prog_);
          if (bVar6) {
            if (((this_01->out_opcode_ & 6) != 0) ||
               (Push(this,(this_01->field_1).cap_,(char *)p,0), (this_01->out_opcode_ & 6) != 0)) {
              __assert_fail("opcode() == kInstAlt || opcode() == kInstAltMatch",
                            "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/prog.h"
                            ,0x6d,"int re2::Prog::Inst::out1()");
            }
            uVar10 = (this_01->field_1).cap_;
            bVar6 = true;
            p = p_00;
          }
          else {
            Push(this,this_01->out_opcode_ >> 4,(char *)p_00,0);
            uVar10 = this_01->out_opcode_ >> 4;
            bVar6 = true;
          }
LAB_00132d9c:
          lVar14 = (long)(int)uVar10;
          pbVar11 = p + (((long)(this->text_).length_ + 1) * lVar14 - (long)(this->text_).ptr_);
          uVar7 = this->visited_[(ulong)pbVar11 >> 5];
          if ((uVar7 >> ((uint)pbVar11 & 0x1f) & 1) != 0) break;
          this->visited_[(ulong)pbVar11 >> 5] = 1 << ((byte)pbVar11 & 0x1f) | uVar7;
          this_01 = this->prog_->inst_ + lVar14;
          uVar7 = this_01->out_opcode_;
          switch(uVar7 & 7) {
          case 0:
            goto switchD_00132cd0_caseD_0;
          case 1:
            goto switchD_00132cd0_caseD_1;
          case 2:
switchD_00132cd0_caseD_2:
            uVar10 = 0xffffffff;
            if (p < p_00) {
              uVar10 = (uint)*p;
            }
            uVar12 = uVar10 | 0x20;
            if ((this_01->field_1).field_3.foldcase_ == '\0') {
              uVar12 = uVar10;
            }
            if (0x19 < uVar10 - 0x41) {
              uVar12 = uVar10;
            }
            if (((int)(uint)(this_01->field_1).field_3.lo_ <= (int)uVar12) &&
               ((int)uVar12 <= (int)(uint)(this_01->field_1).field_3.hi_)) {
              if ((uVar7 & 8) == 0) {
                Push(this,(int)lVar14 + 1,(char *)p,0);
                uVar7 = this_01->out_opcode_;
              }
              uVar10 = uVar7 >> 4;
              p = p + 1;
              goto LAB_00132d9c;
            }
            break;
          case 3:
switchD_00132cd0_caseD_3:
            if (iVar8 == 0) {
              if ((uVar7 & 8) == 0) {
                Push(this,uVar10 + 1,(char *)p,0);
                uVar7 = this_01->out_opcode_;
              }
              if ((uVar7 & 7) != 3) {
LAB_001330e3:
                __assert_fail("(opcode()) == (kInstCapture)",
                              "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/prog.h"
                              ,0x6e,"int re2::Prog::Inst::cap()");
              }
              iVar1 = (this_01->field_1).cap_;
              if ((-1 < (long)iVar1) && (iVar1 < this->ncap_)) {
                Push(this,uVar10,this->cap_[iVar1],1);
                uVar7 = this_01->out_opcode_;
                if ((uVar7 & 7) != 3) goto LAB_001330e3;
                this->cap_[(this_01->field_1).cap_] = (char *)p;
              }
              goto LAB_00132fde;
            }
            if (iVar8 == 1) {
              this->cap_[(this_01->field_1).cap_] = (char *)p;
              goto switchD_00132cd0_caseD_7;
            }
            LogMessage::LogMessage
                      (&local_1b0,
                       "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/bitstate.cc"
                       ,0xfa,3);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&local_1b0.str_,"Bad arg in kInstCapture: ",0x19);
            std::ostream::operator<<((ostream *)&local_1b0.str_,iVar8);
            goto LAB_0013303b;
          case 4:
switchD_00132cd0_caseD_4:
            uVar10 = (this_01->field_1).out1_;
            uVar9 = Prog::EmptyFlags(&this->context_,(char *)p);
            if ((uVar10 & ~uVar9) == 0) {
              uVar7 = this_01->out_opcode_;
              goto switchD_00132cd0_caseD_6;
            }
            break;
          case 5:
switchD_00132cd0_caseD_5:
            if ((this->endmatch_ != true) ||
               (p == (byte *)((this->text_).ptr_ + (this->text_).length_))) {
              uVar10 = this->nsubmatch_;
              if ((ulong)uVar10 == 0) {
                return true;
              }
              this->cap_[1] = (char *)p;
              pSVar3 = this->submatch_;
              if (pSVar3->ptr_ == (char *)0x0) {
                if (0 < (int)uVar10) goto LAB_00132ebc;
              }
              else if ((this->longest_ == true) &&
                      (pSVar3->ptr_ + pSVar3->length_ < p && 0 < (int)uVar10)) {
LAB_00132ebc:
                ppcVar4 = this->cap_;
                lVar13 = 0;
                do {
                  uVar5 = *(undefined8 *)((long)ppcVar4 + lVar13);
                  iVar1 = *(int *)((long)ppcVar4 + lVar13 + 8);
                  *(undefined8 *)((long)&pSVar3->ptr_ + lVar13) = uVar5;
                  *(int *)((long)&pSVar3->length_ + lVar13) = iVar1 - (int)uVar5;
                  lVar13 = lVar13 + 0x10;
                } while ((ulong)uVar10 << 4 != lVar13);
              }
              if (this->longest_ != true) {
                return true;
              }
              local_1c8 = true;
              if (p == (byte *)((this->text_).ptr_ + (this->text_).length_)) {
                return true;
              }
            }
            break;
          case 6:
switchD_00132cd0_caseD_6:
            if ((uVar7 & 8) == 0) {
              Push(this,(int)lVar14 + 1,(char *)p,0);
              uVar7 = this_01->out_opcode_;
            }
LAB_00132fde:
            uVar10 = uVar7 >> 4;
            goto LAB_00132d9c;
          case 7:
            goto switchD_00132cd0_caseD_7;
          }
          if (((byte)this->prog_->inst_[lVar14].out_opcode_ >> 3 & 1) != 0 || bVar6) break;
          uVar10 = (int)lVar14 + 1;
          bVar6 = false;
          goto LAB_00132d9c;
        }
        if (iVar8 == 1) {
          bVar6 = false;
        }
        else {
          LogMessage::LogMessage
                    (&local_1b0,
                     "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/bitstate.cc"
                     ,0xd4,3);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_1b0.str_,"Bad arg in kInstAltMatch: ",0x1a);
          std::ostream::operator<<((ostream *)&local_1b0.str_,iVar8);
LAB_0013303b:
          LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_1b0);
        }
        break;
      case 2:
        goto switchD_00132cd0_caseD_2;
      case 3:
        goto switchD_00132cd0_caseD_3;
      case 4:
        goto switchD_00132cd0_caseD_4;
      case 5:
        goto switchD_00132cd0_caseD_5;
      case 6:
        goto switchD_00132cd0_caseD_6;
      }
switchD_00132cd0_caseD_7:
      iVar8 = this->njob_;
    } while (0 < iVar8);
  }
  return local_1c8;
}

Assistant:

bool BitState::TrySearch(int id0, const char* p0) {
  bool matched = false;
  bool inaltmatch = false;
  const char* end = text_.end();
  njob_ = 0;
  Push(id0, p0, 0);
  while (njob_ > 0) {
    // Pop job off stack.
    --njob_;
    int id = job_[njob_].id;
    const char* p = job_[njob_].p;
    int arg = job_[njob_].arg;

    // Optimization: rather than push and pop,
    // code that is going to Push and continue
    // the loop simply updates ip, p, and arg
    // and jumps to CheckAndLoop.  We have to
    // do the ShouldVisit check that Push
    // would have, but we avoid the stack
    // manipulation.
    if (0) {
    Next:
      // If the Match of a non-greedy AltMatch failed,
      // we stop ourselves from trying the ByteRange,
      // which would steer us off the short circuit.
      if (prog_->inst(id)->last() || inaltmatch)
        continue;
      id++;

    CheckAndLoop:
      if (!ShouldVisit(id, p))
        continue;
    }

    // Visit ip, p.
    // VLOG(0) << "Job: " << ip->id() << " "
    //         << (p - text_.begin()) << " " << arg;
    Prog::Inst* ip = prog_->inst(id);
    switch (ip->opcode()) {
      default:
        LOG(DFATAL) << "Unexpected opcode: " << ip->opcode() << " arg " << arg;
        return false;

      case kInstFail:
        continue;

      case kInstAltMatch:
        switch (arg) {
          case 0:
            inaltmatch = true;
            Push(id, p, 1);  // come back when we're done

            // One opcode is ByteRange; the other leads to Match
            // (possibly via Nop or Capture).
            if (ip->greedy(prog_)) {
              // out1 is the match
              Push(ip->out1(), p, 0);
              id = ip->out1();
              p = end;
              goto CheckAndLoop;
            }
            // out is the match - non-greedy
            Push(ip->out(), end, 0);
            id = ip->out();
            goto CheckAndLoop;

          case 1:
            inaltmatch = false;
            continue;
        }
        LOG(DFATAL) << "Bad arg in kInstAltMatch: " << arg;
        continue;

      case kInstByteRange: {
        int c = -1;
        if (p < end)
          c = *p & 0xFF;
        if (!ip->Matches(c))
          goto Next;

        if (!ip->last())
          Push(id+1, p, 0);  // try the next when we're done
        id = ip->out();
        p++;
        goto CheckAndLoop;
      }

      case kInstCapture:
        switch (arg) {
          case 0:
            if (!ip->last())
              Push(id+1, p, 0);  // try the next when we're done

            if (0 <= ip->cap() && ip->cap() < ncap_) {
              // Capture p to register, but save old value.
              Push(id, cap_[ip->cap()], 1);  // come back when we're done
              cap_[ip->cap()] = p;
            }

            // Continue on.
            id = ip->out();
            goto CheckAndLoop;

          case 1:
            // Finished ip->out(); restore the old value.
            cap_[ip->cap()] = p;
            continue;
        }
        LOG(DFATAL) << "Bad arg in kInstCapture: " << arg;
        continue;

      case kInstEmptyWidth:
        if (ip->empty() & ~Prog::EmptyFlags(context_, p))
          goto Next;

        if (!ip->last())
          Push(id+1, p, 0);  // try the next when we're done
        id = ip->out();
        goto CheckAndLoop;

      case kInstNop:
        if (!ip->last())
          Push(id+1, p, 0);  // try the next when we're done
        id = ip->out();
        goto CheckAndLoop;

      case kInstMatch: {
        if (endmatch_ && p != text_.end())
          goto Next;

        // VLOG(0) << "Found match.";
        // We found a match.  If the caller doesn't care
        // where the match is, no point going further.
        if (nsubmatch_ == 0)
          return true;

        // Record best match so far.
        // Only need to check end point, because this entire
        // call is only considering one start position.
        matched = true;
        cap_[1] = p;
        if (submatch_[0].data() == NULL ||
            (longest_ && p > submatch_[0].end())) {
          for (int i = 0; i < nsubmatch_; i++)
            submatch_[i].set(cap_[2*i],
                             static_cast<int>(cap_[2*i+1] - cap_[2*i]));
        }

        // If going for first match, we're done.
        if (!longest_)
          return true;

        // If we used the entire text, no longer match is possible.
        if (p == text_.end())
          return true;

        // Otherwise, continue on in hope of a longer match.
        goto Next;
      }
    }
  }
  return matched;
}